

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CtorExceptionText.h
# Opt level: O0

string * __thiscall
oout::CtorExceptionText<WithException>::asString_abi_cxx11_
          (string *__return_storage_ptr__,CtorExceptionText<WithException> *this)

{
  runtime_error *this_00;
  exception *e;
  CtorExceptionText<WithException> *this_local;
  
  std::function<void_()>::operator()(&this->invoker);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Class ctor don\'t throw exception");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string asString() const override
	{
		try {
			invoker();
		} catch (const std::exception &e) {
			return e.what();
		}
		throw std::runtime_error("Class ctor don't throw exception");
	}